

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightBounds * __thiscall
pbrt::DiffuseAreaLight::Bounds(LightBounds *__return_storage_ptr__,DiffuseAreaLight *this)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  short sVar4;
  float *pfVar5;
  Tuple2<pbrt::Point2,_int> TVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  int c;
  int c_00;
  Curve *this_00;
  ulong uVar10;
  Float FVar11;
  float fVar12;
  float __x;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 local_70 [8];
  float fStack_68;
  Float FStack_64;
  bool local_60;
  LightBounds *local_58;
  long local_50;
  Bounds3f local_48;
  
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    pfVar9 = (this->Lemit).values.ptr;
    uVar10 = (this->Lemit).values.nStored;
    if (1 < uVar10) {
      lVar8 = uVar10 * 4 + -4;
      pfVar7 = pfVar9;
      do {
        pfVar7 = pfVar7 + 1;
        pfVar5 = pfVar7;
        if (*pfVar7 <= *pfVar9) {
          pfVar5 = pfVar9;
        }
        pfVar9 = pfVar5;
        lVar8 = lVar8 + -4;
      } while (lVar8 != 0);
    }
    fVar12 = *pfVar9;
  }
  else {
    TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
    if (TVar6.y < 1) {
      fVar12 = 0.0;
    }
    else {
      fVar12 = 0.0;
      lVar8 = 0;
      local_58 = __return_storage_ptr__;
      do {
        local_50 = lVar8;
        if (0 < (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x) {
          uVar10 = 0;
          do {
            c_00 = 0;
            do {
              FVar11 = Image::GetChannel(&this->image,(Point2i)(lVar8 << 0x20 | uVar10),c_00,
                                         (WrapMode2D)0x200000002);
              fVar12 = fVar12 + FVar11;
              c_00 = c_00 + 1;
            } while (c_00 != 3);
            uVar10 = uVar10 + 1;
          } while ((long)uVar10 < (long)(this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x);
        }
        lVar8 = local_50 + 1;
        TVar6 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
        __return_storage_ptr__ = local_58;
      } while (lVar8 < (long)TVar6 >> 0x20);
    }
    fVar12 = fVar12 / (float)(TVar6.x * TVar6.y * 3);
  }
  fVar1 = this->scale;
  local_58 = (LightBounds *)CONCAT44(local_58._4_4_,(uint)this->twoSided);
  local_50 = CONCAT44(local_50._4_4_,this->area);
  uVar10 = (this->shape).
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           .bits;
  sVar4 = (short)(uVar10 >> 0x30);
  if (uVar10 >> 0x32 == 0) {
    if ((0x1ffffffffffff < uVar10) && (sVar4 != 2)) {
      Disk::NormalBounds((DirectionCone *)local_70,(Disk *)(uVar10 & 0xffffffffffff));
      goto LAB_00387a94;
    }
  }
  else {
    if (uVar10 >> 0x30 == 5) {
      BilinearPatch::NormalBounds
                ((DirectionCone *)local_70,(BilinearPatch *)(uVar10 & 0xffffffffffff));
      goto LAB_00387a94;
    }
    if (sVar4 == 4) {
      Triangle::NormalBounds((DirectionCone *)local_70,(Triangle *)(uVar10 & 0xffffffffffff));
      goto LAB_00387a94;
    }
  }
  _local_70 = vmovhps_avx(ZEXT816(0) << 0x40,0xbf8000003f800000);
  local_60 = false;
LAB_00387a94:
  uVar10 = (this->shape).
           super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
           .bits;
  sVar4 = (short)(uVar10 >> 0x30);
  if (uVar10 < 0x4000000000000) {
    if (uVar10 < 0x2000000000000) {
      Sphere::Bounds(&local_48,(Sphere *)(uVar10 & 0xffffffffffff));
    }
    else if (sVar4 == 2) {
      Cylinder::Bounds(&local_48,(Cylinder *)(uVar10 & 0xffffffffffff));
    }
    else {
      Disk::Bounds(&local_48,(Disk *)(uVar10 & 0xffffffffffff));
    }
  }
  else {
    this_00 = (Curve *)(uVar10 & 0xffffffffffff);
    if (uVar10 >> 0x30 == 5) {
      BilinearPatch::Bounds(&local_48,(BilinearPatch *)this_00);
    }
    else if (sVar4 == 4) {
      Triangle::Bounds(&local_48,(Triangle *)this_00);
    }
    else {
      Curve::Bounds(&local_48,this_00);
    }
  }
  auVar14 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)FStack_64));
  fVar1 = (float)((uint)((byte)local_58 & 1) * 0x40000000 +
                 (uint)!(bool)((byte)local_58 & 1) * 0x3f800000) * fVar1 * (float)local_50;
  uVar2 = vcmpss_avx512f(ZEXT416((uint)FStack_64),SUB6416(ZEXT464(0xbf800000),0),1);
  bVar3 = (bool)((byte)uVar2 & 1);
  __x = acosf((float)((uint)bVar3 * -0x40800000 + (uint)!bVar3 * auVar14._0_4_));
  bVar3 = this->twoSided;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       local_48.pMax.super_Tuple3<pbrt::Point3,_float>.y;
  (__return_storage_ptr__->b).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       local_48.pMax.super_Tuple3<pbrt::Point3,_float>.z;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       local_48.pMin.super_Tuple3<pbrt::Point3,_float>.x;
  (__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       local_48.pMin.super_Tuple3<pbrt::Point3,_float>.y;
  *(undefined8 *)&(__return_storage_ptr__->b).pMin.super_Tuple3<pbrt::Point3,_float>.z =
       local_48._8_8_;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)((float)local_70._4_4_ * (float)local_70._4_4_)),
                            ZEXT416((uint)local_70._0_4_),ZEXT416((uint)local_70._0_4_));
  auVar14 = vfmadd213ss_fma(ZEXT416((uint)fStack_68),ZEXT416((uint)fStack_68),auVar14);
  if (auVar14._0_4_ < 0.0) {
    fVar13 = sqrtf(auVar14._0_4_);
  }
  else {
    auVar14 = vsqrtss_avx(auVar14,auVar14);
    fVar13 = auVar14._0_4_;
  }
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_70;
  auVar15._4_4_ = fVar13;
  auVar15._0_4_ = fVar13;
  auVar15._8_4_ = fVar13;
  auVar15._12_4_ = fVar13;
  auVar14 = vdivps_avx(auVar14,auVar15);
  uVar2 = vmovlps_avx(auVar14);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = fStack_68 / fVar13;
  __return_storage_ptr__->phi = fVar1 * 3.1415927 * fVar12;
  __return_storage_ptr__->theta_o = __x;
  __return_storage_ptr__->theta_e = 1.5707964;
  fVar12 = cosf(__x);
  __return_storage_ptr__->cosTheta_o = fVar12;
  __return_storage_ptr__->cosTheta_e = -4.371139e-08;
  __return_storage_ptr__->twoSided = bVar3;
  return __return_storage_ptr__;
}

Assistant:

LightBounds DiffuseAreaLight::Bounds() const {
    Float phi = 0;
    if (image) {
        // Assume no distortion in the mapping, FWIW...
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                for (int c = 0; c < 3; ++c)
                    phi += image.GetChannel({x, y}, c);
        phi /= 3 * image.Resolution().x * image.Resolution().y;
    } else
        phi = Lemit.MaxValue();

    phi *= scale * (twoSided ? 2 : 1) * area * Pi;

    // TODO: for animated shapes, we probably need to worry about
    // renderFromLight as in SampleLi().
    DirectionCone nb = shape.NormalBounds();
    return LightBounds(shape.Bounds(), nb.w, phi, SafeACos(nb.cosTheta), Pi / 2,
                       twoSided);
}